

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
* __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *__return_storage_ptr__,CompilerGLSL *this,SPIRType *basetype,uint32_t *indices,
          uint32_t count,uint32_t offset,uint32_t word_stride,bool *need_transpose,
          uint32_t *out_matrix_stride,uint32_t *out_array_stride,bool ptr_chain)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  ulong uVar4;
  size_t sVar5;
  TypedID *this_00;
  uint local_458;
  uint local_454;
  uint local_420;
  uint local_41c;
  uint32_t local_364;
  uint32_t local_360;
  byte local_359;
  allocator local_339;
  string local_338 [36];
  uint local_314;
  spirv_cross local_310 [32];
  undefined1 local_2f0 [40];
  string local_2c8 [36];
  uint local_2a4;
  SPIRConstant *pSStack_2a0;
  uint32_t indexing_stride_1;
  SPIRConstant *constant_3;
  spirv_cross local_290 [32];
  undefined1 local_270 [40];
  string local_248 [36];
  uint local_224;
  SPIRConstant *pSStack_220;
  uint32_t indexing_stride;
  SPIRConstant *constant_2;
  SPIRType *local_1d8;
  SPIRType *struct_type;
  string local_1c8 [36];
  ID local_1a4;
  uint32_t local_1a0;
  uint local_19c;
  uint32_t parent_type;
  undefined1 local_178 [40];
  string local_150 [32];
  SPIRConstant *local_130;
  SPIRConstant *constant_1;
  spirv_cross local_120 [32];
  undefined1 local_100 [40];
  string local_d8 [32];
  SPIRConstant *local_b8;
  SPIRConstant *constant;
  string local_a8 [48];
  uint32_t local_78;
  uint32_t local_74;
  uint local_70;
  uint32_t index;
  uint32_t i;
  uint32_t array_stride;
  uint32_t matrix_stride;
  bool row_major_matrix_needs_conversion;
  string expr;
  SPIRType *local_40;
  SPIRType *type;
  uint32_t local_30;
  uint32_t uStack_2c;
  bool ptr_chain_local;
  uint32_t offset_local;
  uint32_t count_local;
  uint32_t *indices_local;
  SPIRType *basetype_local;
  CompilerGLSL *this_local;
  
  local_30 = offset;
  uStack_2c = count;
  _offset_local = indices;
  indices_local = (uint32_t *)basetype;
  basetype_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  local_40 = Compiler::get_pointee_type(&this->super_Compiler,basetype);
  ::std::__cxx11::string::string((string *)&matrix_stride);
  if (need_transpose == (bool *)0x0) {
    local_359 = 0;
  }
  else {
    local_359 = *need_transpose;
  }
  array_stride._3_1_ = local_359 & 1;
  if (out_matrix_stride == (uint32_t *)0x0) {
    local_360 = 0;
  }
  else {
    local_360 = *out_matrix_stride;
  }
  i = local_360;
  if (out_array_stride == (uint32_t *)0x0) {
    local_364 = 0;
  }
  else {
    local_364 = *out_array_stride;
  }
  index = local_364;
  local_70 = 0;
  do {
    if (uStack_2c <= local_70) {
      if (need_transpose != (bool *)0x0) {
        *need_transpose = (bool)(array_stride._3_1_ & 1);
      }
      if (out_matrix_stride != (uint32_t *)0x0) {
        *out_matrix_stride = i;
      }
      if (out_array_stride != (uint32_t *)0x0) {
        *out_array_stride = index;
      }
      ::std::make_pair<std::__cxx11::string&,unsigned_int&>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matrix_stride
                 ,&local_30);
      ::std::__cxx11::string::~string((string *)&matrix_stride);
      return __return_storage_ptr__;
    }
    local_74 = _offset_local[local_70];
    uVar2 = (uint32_t)this;
    if ((ptr_chain) && (local_70 == 0)) {
      local_78 = indices_local[2];
      index = Compiler::get_decoration(&this->super_Compiler,(ID)local_78,DecorationArrayStride);
      if (index == 0) {
        constant._6_1_ = 1;
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a8,"SPIR-V does not define ArrayStride for buffer block.",
                   (allocator *)((long)&constant + 7));
        CompilerError::CompilerError(pCVar3,(string *)local_a8);
        constant._6_1_ = 0;
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_b8 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,local_74);
      if (local_b8 == (SPIRConstant *)0x0) {
        if (index % word_stride != 0) {
          local_100[0x26] = '\x01';
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_d8,
                     "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                     ,(allocator *)(local_100 + 0x27));
          CompilerError::CompilerError(pCVar3,(string *)local_d8);
          local_100[0x26] = '\0';
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_100,uVar2,SUB41(local_74,0));
        ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)local_100);
        ::std::__cxx11::string::~string((string *)local_100);
        ::std::__cxx11::string::operator+=((string *)&matrix_stride," * ");
        constant_1._4_4_ = index / word_stride;
        convert_to_string<unsigned_int,_0>(local_120,(uint *)((long)&constant_1 + 4));
        ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)local_120);
        ::std::__cxx11::string::~string((string *)local_120);
        ::std::__cxx11::string::operator+=((string *)&matrix_stride," + ");
      }
      else {
        uVar2 = SPIRConstant::scalar(local_b8,0,0);
        local_30 = uVar2 * index + local_30;
      }
    }
    else {
      bVar1 = VectorView<unsigned_int>::empty(&(local_40->array).super_VectorView<unsigned_int>);
      if (bVar1) {
        if (*(int *)&(local_40->super_IVariant).field_0xc == 0xf) {
          local_74 = Compiler::evaluate_constant_u32(&this->super_Compiler,local_74);
          uVar4 = (ulong)local_74;
          sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(local_40->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
          if (sVar5 <= uVar4) {
            struct_type._6_1_ = 1;
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1c8,"Member index is out of bounds!",
                       (allocator *)((long)&struct_type + 7));
            CompilerError::CompilerError(pCVar3,(string *)local_1c8);
            struct_type._6_1_ = 0;
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          uVar2 = Compiler::type_struct_member_offset(&this->super_Compiler,local_40,local_74);
          local_30 = local_30 + uVar2;
          local_1d8 = local_40;
          this_00 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(local_40->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)local_74);
          uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
          local_40 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
          if (local_40->columns < 2) {
            array_stride._3_1_ = 0;
          }
          else {
            i = Compiler::type_struct_member_matrix_stride(&this->super_Compiler,local_1d8,local_74)
            ;
            Compiler::combined_decoration_for_member
                      ((Bitset *)&constant_2,&this->super_Compiler,local_1d8,local_74);
            array_stride._3_1_ = Bitset::get((Bitset *)&constant_2,4);
            Bitset::~Bitset((Bitset *)&constant_2);
          }
          bVar1 = VectorView<unsigned_int>::empty(&(local_40->array).super_VectorView<unsigned_int>)
          ;
          if (!bVar1) {
            index = Compiler::type_struct_member_array_stride
                              (&this->super_Compiler,local_1d8,local_74);
          }
        }
        else if (local_40->columns < 2) {
          if (local_40->vecsize < 2) {
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_338,"Cannot subdivide a scalar value!",&local_339);
            CompilerError::CompilerError(pCVar3,(string *)local_338);
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pSStack_2a0 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                                  (&this->super_Compiler,local_74);
          if (pSStack_2a0 == (SPIRConstant *)0x0) {
            if ((array_stride._3_1_ & 1) == 0) {
              local_458 = local_40->width >> 3;
            }
            else {
              local_458 = i;
            }
            local_2a4 = local_458;
            if (local_458 % word_stride != 0) {
              local_2f0[0x26] = 1;
              pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_2c8,
                         "Stride for dynamic vector indexing must be divisible by the size of a 4-component vector. This cannot be flattened in legacy targets."
                         ,(allocator *)(local_2f0 + 0x27));
              CompilerError::CompilerError(pCVar3,(string *)local_2c8);
              local_2f0[0x26] = 0;
              __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_2f0,uVar2,SUB41(local_74,0));
            ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)local_2f0);
            ::std::__cxx11::string::~string((string *)local_2f0);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride," * ");
            local_314 = local_2a4 / word_stride;
            convert_to_string<unsigned_int,_0>(local_310,&local_314);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)local_310);
            ::std::__cxx11::string::~string((string *)local_310);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride," + ");
          }
          else {
            local_74 = Compiler::evaluate_constant_u32(&this->super_Compiler,local_74);
            if ((array_stride._3_1_ & 1) == 0) {
              local_454 = local_40->width >> 3;
            }
            else {
              local_454 = i;
            }
            local_30 = local_74 * local_454 + local_30;
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_40->parent_type);
          local_40 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
        }
        else {
          pSStack_220 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                                  (&this->super_Compiler,local_74);
          if (pSStack_220 == (SPIRConstant *)0x0) {
            if ((array_stride._3_1_ & 1) == 0) {
              local_420 = i;
            }
            else {
              local_420 = local_40->width >> 3;
            }
            local_224 = local_420;
            if (local_420 % word_stride != 0) {
              local_270[0x26] = '\x01';
              pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_248,
                         "Matrix stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a row-major matrix being accessed dynamically. This cannot be flattened. Try using std140 layout instead."
                         ,(allocator *)(local_270 + 0x27));
              CompilerError::CompilerError(pCVar3,(string *)local_248);
              local_270[0x26] = '\0';
              __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_270,uVar2,SUB41(local_74,0));
            ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)local_270);
            ::std::__cxx11::string::~string((string *)local_270);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride," * ");
            constant_3._4_4_ = local_224 / word_stride;
            convert_to_string<unsigned_int,_0>(local_290,(uint *)((long)&constant_3 + 4));
            ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)local_290);
            ::std::__cxx11::string::~string((string *)local_290);
            ::std::__cxx11::string::operator+=((string *)&matrix_stride," + ");
          }
          else {
            local_74 = Compiler::evaluate_constant_u32(&this->super_Compiler,local_74);
            if ((array_stride._3_1_ & 1) == 0) {
              local_41c = i;
            }
            else {
              local_41c = local_40->width >> 3;
            }
            local_30 = local_74 * local_41c + local_30;
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_40->parent_type);
          local_40 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
        }
      }
      else {
        local_130 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,local_74);
        if (local_130 == (SPIRConstant *)0x0) {
          if (index % word_stride != 0) {
            local_178[0x26] = '\x01';
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_150,
                       "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                       ,(allocator *)(local_178 + 0x27));
            CompilerError::CompilerError(pCVar3,(string *)local_150);
            local_178[0x26] = '\0';
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_178,uVar2,SUB41(local_74,0));
          ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)local_178);
          ::std::__cxx11::string::~string((string *)local_178);
          ::std::__cxx11::string::operator+=((string *)&matrix_stride," * ");
          local_19c = index / word_stride;
          convert_to_string<unsigned_int,_0>((spirv_cross *)&parent_type,&local_19c);
          ::std::__cxx11::string::operator+=((string *)&matrix_stride,(string *)&parent_type);
          ::std::__cxx11::string::~string((string *)&parent_type);
          ::std::__cxx11::string::operator+=((string *)&matrix_stride," + ");
        }
        else {
          uVar2 = SPIRConstant::scalar(local_130,0,0);
          local_30 = uVar2 * index + local_30;
        }
        local_1a0 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_40->parent_type);
        local_40 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,local_1a0);
        bVar1 = VectorView<unsigned_int>::empty(&(local_40->array).super_VectorView<unsigned_int>);
        if (!bVar1) {
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1a4,local_1a0);
          index = Compiler::get_decoration(&this->super_Compiler,local_1a4,DecorationArrayStride);
        }
      }
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

std::pair<std::string, uint32_t> CompilerGLSL::flattened_access_chain_offset(
    const SPIRType &basetype, const uint32_t *indices, uint32_t count, uint32_t offset, uint32_t word_stride,
    bool *need_transpose, uint32_t *out_matrix_stride, uint32_t *out_array_stride, bool ptr_chain)
{
	// Start traversing type hierarchy at the proper non-pointer types.
	const auto *type = &get_pointee_type(basetype);

	std::string expr;

	// Inherit matrix information in case we are access chaining a vector which might have come from a row major layout.
	bool row_major_matrix_needs_conversion = need_transpose ? *need_transpose : false;
	uint32_t matrix_stride = out_matrix_stride ? *out_matrix_stride : 0;
	uint32_t array_stride = out_array_stride ? *out_array_stride : 0;

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		// Pointers
		if (ptr_chain && i == 0)
		{
			// Here, the pointer type will be decorated with an array stride.
			array_stride = get_decoration(basetype.self, DecorationArrayStride);
			if (!array_stride)
				SPIRV_CROSS_THROW("SPIR-V does not define ArrayStride for buffer block.");

			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}
		}
		// Arrays
		else if (!type->array.empty())
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}

			uint32_t parent_type = type->parent_type;
			type = &get<SPIRType>(parent_type);

			if (!type->array.empty())
				array_stride = get_decoration(parent_type, DecorationArrayStride);
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			offset += type_struct_member_offset(*type, index);

			auto &struct_type = *type;
			type = &get<SPIRType>(type->member_types[index]);

			if (type->columns > 1)
			{
				matrix_stride = type_struct_member_matrix_stride(struct_type, index);
				row_major_matrix_needs_conversion =
				    combined_decoration_for_member(struct_type, index).get(DecorationRowMajor);
			}
			else
				row_major_matrix_needs_conversion = false;

			if (!type->array.empty())
				array_stride = type_struct_member_array_stride(struct_type, index);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride);
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride;
				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Matrix stride for dynamic indexing must be divisible by the size of a "
					                  "4-component vector. "
					                  "Likely culprit here is a row-major matrix being accessed dynamically. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8));
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8);

				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Stride for dynamic vector indexing must be divisible by the "
					                  "size of a 4-component vector. "
					                  "This cannot be flattened in legacy targets.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		else
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (need_transpose)
		*need_transpose = row_major_matrix_needs_conversion;
	if (out_matrix_stride)
		*out_matrix_stride = matrix_stride;
	if (out_array_stride)
		*out_array_stride = array_stride;

	return std::make_pair(expr, offset);
}